

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall
CVmObjDict::getp_set_comparator(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  int iVar1;
  vm_val_t *pvVar2;
  vm_dict_ext *pvVar3;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  dict_undo_rec *undo_rec;
  vm_obj_id_t comp;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  vm_datatype_t vVar4;
  dict_undo_rec *in_stack_ffffffffffffffc0;
  dict_undo_action in_stack_ffffffffffffffcc;
  CVmObjDict *in_stack_ffffffffffffffd0;
  
  if ((getp_set_comparator(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_set_comparator(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_set_comparator::desc,1);
    __cxa_guard_release(&getp_set_comparator(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    pvVar2 = CVmStack::get(0);
    vVar4 = pvVar2->typ;
    if (vVar4 != VM_NIL) {
      if (vVar4 != VM_OBJ) {
        err_throw(0);
      }
      CVmStack::get(0);
    }
    if (G_undo_X != (CVmUndo *)0x0) {
      in_stack_ffffffffffffffc0 =
           alloc_undo_rec(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                          (char *)in_stack_ffffffffffffffc0,(size_t)in_RDI);
      pvVar3 = get_ext((CVmObjDict *)in_RDI);
      in_stack_ffffffffffffffc0->obj = pvVar3->comparator_;
      add_undo_rec((CVmObjDict *)in_stack_ffffffffffffffc0,(vm_obj_id_t)((ulong)in_RDI >> 0x20),
                   (dict_undo_rec *)CONCAT44(vVar4,in_stack_ffffffffffffffb0));
    }
    set_comparator((CVmObjDict *)in_stack_ffffffffffffffc0,(vm_obj_id_t)((ulong)in_RDI >> 0x20));
    pvVar3 = get_ext((CVmObjDict *)in_RDI);
    pvVar3->modified_ = 1;
    CVmStack::discard();
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_set_comparator(VMG_ vm_obj_id_t self, vm_val_t *val,
                                    uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    vm_obj_id_t comp;
    
    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* get the comparator object */
    switch(G_stk->get(0)->typ)
    {
    case VM_NIL:
        comp = VM_INVALID_OBJ;
        break;

    case VM_OBJ:
        comp = G_stk->get(0)->val.obj;
        break;

    default:
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if there's a global undo object, add undo for the change */
    if (G_undo != 0)
    {
        dict_undo_rec *undo_rec;

        /* create an undo record with the original comparator */
        undo_rec = alloc_undo_rec(DICT_UNDO_COMPARATOR, 0, 0);
        undo_rec->obj = get_ext()->comparator_;

        /* add the undo record */
        add_undo_rec(vmg_ self, undo_rec);
    }

    /* set our new comparator object */
    set_comparator(vmg_ comp);

    /* mark the object as modified since load */
    get_ext()->modified_ = TRUE;

    /* discard arguments */
    G_stk->discard();

    /* no return value - just return nil */
    val->set_nil();

    /* handled */
    return TRUE;
}